

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# conncache.c
# Opt level: O3

int cpool_reap_dead_cb(Curl_easy *data,connectdata *conn,void *param)

{
  _Bool _Var1;
  
  _Var1 = Curl_conn_seems_dead(conn,data,(curltime *)param);
  if (_Var1) {
    Curl_cpool_disconnect(data,conn,false);
  }
  return (uint)_Var1;
}

Assistant:

static int cpool_reap_dead_cb(struct Curl_easy *data,
                              struct connectdata *conn, void *param)
{
  struct cpool_reaper_ctx *rctx = param;
  if(Curl_conn_seems_dead(conn, data, &rctx->now)) {
    /* stop the iteration here, pass back the connection that was pruned */
    Curl_cpool_disconnect(data, conn, FALSE);
    return 1;
  }
  return 0; /* continue iteration */
}